

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::format_uint<4u,char,fmt::v10::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  type tVar1;
  detail *this;
  int in_ECX;
  int num_digits_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  tVar1 = to_unsigned<int>(in_ECX);
  this = (detail *)
         to_pointer<char>((buffer_appender<char>)
                          out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                          (ulong)tVar1);
  num_digits_00 = (int)CONCAT71(in_register_00000011,upper);
  if (this == (detail *)0x0) {
    format_uint<4u,char,unsigned__int128>
              ((detail *)&stack0xffffffffffffffa8,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)ZEXT816(0),num_digits_00,SUB41(in_ECX,0));
    out = copy_str_noinline<char,char*,fmt::v10::appender>
                    (&stack0xffffffffffffffa8,&stack0xffffffffffffffa8 + in_ECX,out);
  }
  else {
    value_00._8_8_ = in_stack_ffffffffffffffb0;
    value_00._0_8_ = in_stack_ffffffffffffffa8;
    format_uint<4u,char,unsigned__int128>
              (this,(char *)CONCAT44(in_register_00000034,num_digits),(unsigned___int128)value_00,
               num_digits_00,SUB41(in_ECX,0));
  }
  return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR inline auto format_uint(It out, UInt value, int num_digits,
                                      bool upper = false) -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1] = {};
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}